

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_7xx(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (((((env->spr_cb[0x3f5].name == (char *)0x0) && (env->spr[0x3f5] == 0)) &&
       (env->spr_cb[0x3f5].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x3f5].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f5].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x3f5].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x3f5].name = "DABR";
    env->spr_cb[0x3f5].uea_read = spr_noaccess;
    env->spr_cb[0x3f5].uea_write = spr_noaccess;
    env->spr_cb[0x3f5].oea_read = spr_read_generic;
    env->spr_cb[0x3f5].oea_write = spr_write_generic;
    env->spr_cb[0x3f5].hea_read = spr_read_generic;
    env->spr_cb[0x3f5].hea_write = spr_write_generic;
    env->spr_cb[0x3f5].default_value = 0;
    env->spr[0x3f5] = 0;
    if (((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
       ((env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f2].name = "IABR";
      env->spr_cb[0x3f2].uea_read = spr_noaccess;
      env->spr_cb[0x3f2].uea_write = spr_noaccess;
      env->spr_cb[0x3f2].oea_read = spr_read_generic;
      env->spr_cb[0x3f2].oea_write = spr_write_generic;
      env->spr_cb[0x3f2].hea_read = spr_read_generic;
      env->spr_cb[0x3f2].hea_write = spr_write_generic;
      env->spr_cb[0x3f2].default_value = 0;
      env->spr[0x3f2] = 0;
      if ((((env->spr_cb[0x3fb].name == (char *)0x0) && (env->spr[0x3fb] == 0)) &&
          ((env->spr_cb[0x3fb].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3fb].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3fb].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x3fb].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        env->spr_cb[0x3fb].name = "ICTC";
        env->spr_cb[0x3fb].uea_read = spr_noaccess;
        env->spr_cb[0x3fb].uea_write = spr_noaccess;
        env->spr_cb[0x3fb].oea_read = spr_read_generic;
        env->spr_cb[0x3fb].oea_write = spr_write_generic;
        env->spr_cb[0x3fb].hea_read = spr_read_generic;
        env->spr_cb[0x3fb].hea_write = spr_write_generic;
        env->spr_cb[0x3fb].default_value = 0;
        env->spr[0x3fb] = 0;
        if ((((env->spr_cb[0x3b8].name == (char *)0x0) && (env->spr[0x3b8] == 0)) &&
            (env->spr_cb[0x3b8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
           (((env->spr_cb[0x3b8].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3b8].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            (env->spr_cb[0x3b8].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
          env->spr_cb[0x3b8].name = "MMCR0";
          env->spr_cb[0x3b8].uea_read = spr_noaccess;
          env->spr_cb[0x3b8].uea_write = spr_noaccess;
          env->spr_cb[0x3b8].oea_read = spr_read_generic;
          env->spr_cb[0x3b8].oea_write = spr_write_generic;
          env->spr_cb[0x3b8].hea_read = spr_read_generic;
          env->spr_cb[0x3b8].hea_write = spr_write_generic;
          env->spr_cb[0x3b8].default_value = 0;
          env->spr[0x3b8] = 0;
          if (((env->spr_cb[0x3bc].name == (char *)0x0) && (env->spr[0x3bc] == 0)) &&
             ((env->spr_cb[0x3bc].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3bc].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3bc].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3bc].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3bc].name = "MMCR1";
            env->spr_cb[0x3bc].uea_read = spr_noaccess;
            env->spr_cb[0x3bc].uea_write = spr_noaccess;
            env->spr_cb[0x3bc].oea_read = spr_read_generic;
            env->spr_cb[0x3bc].oea_write = spr_write_generic;
            env->spr_cb[0x3bc].hea_read = spr_read_generic;
            env->spr_cb[0x3bc].hea_write = spr_write_generic;
            env->spr_cb[0x3bc].default_value = 0;
            env->spr[0x3bc] = 0;
            if (((env->spr_cb[0x3b9].name == (char *)0x0) && (env->spr[0x3b9] == 0)) &&
               (((env->spr_cb[0x3b9].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3b9].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3b9].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                (env->spr_cb[0x3b9].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
              env->spr_cb[0x3b9].name = "PMC1";
              env->spr_cb[0x3b9].uea_read = spr_noaccess;
              env->spr_cb[0x3b9].uea_write = spr_noaccess;
              env->spr_cb[0x3b9].oea_read = spr_read_generic;
              env->spr_cb[0x3b9].oea_write = spr_write_generic;
              env->spr_cb[0x3b9].hea_read = spr_read_generic;
              env->spr_cb[0x3b9].hea_write = spr_write_generic;
              env->spr_cb[0x3b9].default_value = 0;
              env->spr[0x3b9] = 0;
              if (((((env->spr_cb[0x3ba].name == (char *)0x0) && (env->spr[0x3ba] == 0)) &&
                   (env->spr_cb[0x3ba].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  ((env->spr_cb[0x3ba].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3ba].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                 (env->spr_cb[0x3ba].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
                env->spr_cb[0x3ba].name = "PMC2";
                env->spr_cb[0x3ba].uea_read = spr_noaccess;
                env->spr_cb[0x3ba].uea_write = spr_noaccess;
                env->spr_cb[0x3ba].oea_read = spr_read_generic;
                env->spr_cb[0x3ba].oea_write = spr_write_generic;
                env->spr_cb[0x3ba].hea_read = spr_read_generic;
                env->spr_cb[0x3ba].hea_write = spr_write_generic;
                env->spr_cb[0x3ba].default_value = 0;
                env->spr[0x3ba] = 0;
                if (((env->spr_cb[0x3bd].name == (char *)0x0) && (env->spr[0x3bd] == 0)) &&
                   ((env->spr_cb[0x3bd].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x3bd].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x3bd].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x3bd].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x3bd].name = "PMC3";
                  env->spr_cb[0x3bd].uea_read = spr_noaccess;
                  env->spr_cb[0x3bd].uea_write = spr_noaccess;
                  env->spr_cb[0x3bd].oea_read = spr_read_generic;
                  env->spr_cb[0x3bd].oea_write = spr_write_generic;
                  env->spr_cb[0x3bd].hea_read = spr_read_generic;
                  env->spr_cb[0x3bd].hea_write = spr_write_generic;
                  env->spr_cb[0x3bd].default_value = 0;
                  env->spr[0x3bd] = 0;
                  if (((env->spr_cb[0x3be].name == (char *)0x0) && (env->spr[0x3be] == 0)) &&
                     (((env->spr_cb[0x3be].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x3be].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x3be].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x3be].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x3be].name = "PMC4";
                    env->spr_cb[0x3be].uea_read = spr_noaccess;
                    env->spr_cb[0x3be].uea_write = spr_noaccess;
                    env->spr_cb[0x3be].oea_read = spr_read_generic;
                    env->spr_cb[0x3be].oea_write = spr_write_generic;
                    env->spr_cb[0x3be].hea_read = spr_read_generic;
                    env->spr_cb[0x3be].hea_write = spr_write_generic;
                    env->spr_cb[0x3be].default_value = 0;
                    env->spr[0x3be] = 0;
                    if ((((env->spr_cb[0x3bb].name == (char *)0x0) && (env->spr[0x3bb] == 0)) &&
                        (env->spr_cb[0x3bb].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                       && (((env->spr_cb[0x3bb].oea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0 &&
                            (env->spr_cb[0x3bb].uea_read ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                           (env->spr_cb[0x3bb].uea_write ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                      env->spr_cb[0x3bb].name = "SIAR";
                      env->spr_cb[0x3bb].uea_read = spr_noaccess;
                      env->spr_cb[0x3bb].uea_write = spr_noaccess;
                      env->spr_cb[0x3bb].oea_read = spr_read_generic;
                      env->spr_cb[0x3bb].oea_write = spr_noaccess;
                      env->spr_cb[0x3bb].hea_read = spr_read_generic;
                      env->spr_cb[0x3bb].hea_write = spr_noaccess;
                      env->spr_cb[0x3bb].default_value = 0;
                      env->spr[0x3bb] = 0;
                      if (((env->spr_cb[0x3a8].name == (char *)0x0) && (env->spr[0x3a8] == 0)) &&
                         ((env->spr_cb[0x3a8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0
                          && (((env->spr_cb[0x3a8].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3a8].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x3a8].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                        env->spr_cb[0x3a8].name = "UMMCR0";
                        env->spr_cb[0x3a8].uea_read = spr_read_ureg;
                        env->spr_cb[0x3a8].uea_write = spr_noaccess;
                        env->spr_cb[0x3a8].oea_read = spr_read_ureg;
                        env->spr_cb[0x3a8].oea_write = spr_noaccess;
                        env->spr_cb[0x3a8].hea_read = spr_read_ureg;
                        env->spr_cb[0x3a8].hea_write = spr_noaccess;
                        env->spr_cb[0x3a8].default_value = 0;
                        env->spr[0x3a8] = 0;
                        if (((env->spr_cb[0x3ac].name == (char *)0x0) && (env->spr[0x3ac] == 0)) &&
                           (((env->spr_cb[0x3ac].oea_read ==
                              (_func_void_DisasContext_ptr_int_int *)0x0 &&
                             ((env->spr_cb[0x3ac].oea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0 &&
                              (env->spr_cb[0x3ac].uea_read ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                            (env->spr_cb[0x3ac].uea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                          env->spr_cb[0x3ac].name = "UMMCR1";
                          env->spr_cb[0x3ac].uea_read = spr_read_ureg;
                          env->spr_cb[0x3ac].uea_write = spr_noaccess;
                          env->spr_cb[0x3ac].oea_read = spr_read_ureg;
                          env->spr_cb[0x3ac].oea_write = spr_noaccess;
                          env->spr_cb[0x3ac].hea_read = spr_read_ureg;
                          env->spr_cb[0x3ac].hea_write = spr_noaccess;
                          env->spr_cb[0x3ac].default_value = 0;
                          env->spr[0x3ac] = 0;
                          if (((((env->spr_cb[0x3a9].name == (char *)0x0) && (env->spr[0x3a9] == 0))
                               && (env->spr_cb[0x3a9].oea_read ==
                                   (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              ((env->spr_cb[0x3a9].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3a9].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                             (env->spr_cb[0x3a9].uea_write ==
                              (_func_void_DisasContext_ptr_int_int *)0x0)) {
                            env->spr_cb[0x3a9].name = "UPMC1";
                            env->spr_cb[0x3a9].uea_read = spr_read_ureg;
                            env->spr_cb[0x3a9].uea_write = spr_noaccess;
                            env->spr_cb[0x3a9].oea_read = spr_read_ureg;
                            env->spr_cb[0x3a9].oea_write = spr_noaccess;
                            env->spr_cb[0x3a9].hea_read = spr_read_ureg;
                            env->spr_cb[0x3a9].hea_write = spr_noaccess;
                            env->spr_cb[0x3a9].default_value = 0;
                            env->spr[0x3a9] = 0;
                            if (((env->spr_cb[0x3aa].name == (char *)0x0) && (env->spr[0x3aa] == 0))
                               && ((env->spr_cb[0x3aa].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   (((env->spr_cb[0x3aa].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x3aa].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    (env->spr_cb[0x3aa].uea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                              env->spr_cb[0x3aa].name = "UPMC2";
                              env->spr_cb[0x3aa].uea_read = spr_read_ureg;
                              env->spr_cb[0x3aa].uea_write = spr_noaccess;
                              env->spr_cb[0x3aa].oea_read = spr_read_ureg;
                              env->spr_cb[0x3aa].oea_write = spr_noaccess;
                              env->spr_cb[0x3aa].hea_read = spr_read_ureg;
                              env->spr_cb[0x3aa].hea_write = spr_noaccess;
                              env->spr_cb[0x3aa].default_value = 0;
                              env->spr[0x3aa] = 0;
                              if ((((env->spr_cb[0x3ad].name == (char *)0x0) &&
                                   (env->spr[0x3ad] == 0)) &&
                                  ((env->spr_cb[0x3ad].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   ((env->spr_cb[0x3ad].oea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                    (env->spr_cb[0x3ad].uea_read ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
                                 (env->spr_cb[0x3ad].uea_write ==
                                  (_func_void_DisasContext_ptr_int_int *)0x0)) {
                                env->spr_cb[0x3ad].name = "UPMC3";
                                env->spr_cb[0x3ad].uea_read = spr_read_ureg;
                                env->spr_cb[0x3ad].uea_write = spr_noaccess;
                                env->spr_cb[0x3ad].oea_read = spr_read_ureg;
                                env->spr_cb[0x3ad].oea_write = spr_noaccess;
                                env->spr_cb[0x3ad].hea_read = spr_read_ureg;
                                env->spr_cb[0x3ad].hea_write = spr_noaccess;
                                env->spr_cb[0x3ad].default_value = 0;
                                env->spr[0x3ad] = 0;
                                if ((((env->spr_cb[0x3ae].name == (char *)0x0) &&
                                     (env->spr[0x3ae] == 0)) &&
                                    (env->spr_cb[0x3ae].oea_read ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                   (((env->spr_cb[0x3ae].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x3ae].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    (env->spr_cb[0x3ae].uea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                                  env->spr_cb[0x3ae].name = "UPMC4";
                                  env->spr_cb[0x3ae].uea_read = spr_read_ureg;
                                  env->spr_cb[0x3ae].uea_write = spr_noaccess;
                                  env->spr_cb[0x3ae].oea_read = spr_read_ureg;
                                  env->spr_cb[0x3ae].oea_write = spr_noaccess;
                                  env->spr_cb[0x3ae].hea_read = spr_read_ureg;
                                  env->spr_cb[0x3ae].hea_write = spr_noaccess;
                                  env->spr_cb[0x3ae].default_value = 0;
                                  env->spr[0x3ae] = 0;
                                  if (((env->spr_cb[0x3ab].name == (char *)0x0) &&
                                      (env->spr[0x3ab] == 0)) &&
                                     ((env->spr_cb[0x3ab].oea_read ==
                                       (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                      (((env->spr_cb[0x3ab].oea_write ==
                                         (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                        (env->spr_cb[0x3ab].uea_read ==
                                         (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                       (env->spr_cb[0x3ab].uea_write ==
                                        (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                                    env->spr_cb[0x3ab].name = "USIAR";
                                    env->spr_cb[0x3ab].uea_read = spr_read_ureg;
                                    env->spr_cb[0x3ab].uea_write = spr_noaccess;
                                    env->spr_cb[0x3ab].oea_read = spr_read_ureg;
                                    env->spr_cb[0x3ab].oea_write = spr_noaccess;
                                    env->spr_cb[0x3ab].hea_read = spr_read_ureg;
                                    env->spr_cb[0x3ab].hea_write = spr_noaccess;
                                    env->spr_cb[0x3ab].default_value = 0;
                                    env->spr[0x3ab] = 0;
                                    if (((env->spr_cb[0x11a].name == (char *)0x0) &&
                                        (env->spr[0x11a] == 0)) &&
                                       (((env->spr_cb[0x11a].oea_read ==
                                          (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                         ((env->spr_cb[0x11a].oea_write ==
                                           (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                          (env->spr_cb[0x11a].uea_read ==
                                           (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                                        (env->spr_cb[0x11a].uea_write ==
                                         (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                                      env->spr_cb[0x11a].name = "EAR";
                                      env->spr_cb[0x11a].uea_read = spr_noaccess;
                                      env->spr_cb[0x11a].uea_write = spr_noaccess;
                                      env->spr_cb[0x11a].oea_read = spr_read_generic;
                                      env->spr_cb[0x11a].oea_write = spr_write_generic;
                                      env->spr_cb[0x11a].hea_read = spr_read_generic;
                                      env->spr_cb[0x11a].hea_write = spr_write_generic;
                                      env->spr_cb[0x11a].default_value = 0;
                                      env->spr[0x11a] = 0;
                                      return;
                                    }
                                    uVar2 = 0x11a;
                                    uVar1 = 0x11a;
                                  }
                                  else {
                                    uVar2 = 0x3ab;
                                    uVar1 = 0x3ab;
                                  }
                                }
                                else {
                                  uVar2 = 0x3ae;
                                  uVar1 = 0x3ae;
                                }
                              }
                              else {
                                uVar2 = 0x3ad;
                                uVar1 = 0x3ad;
                              }
                            }
                            else {
                              uVar2 = 0x3aa;
                              uVar1 = 0x3aa;
                            }
                          }
                          else {
                            uVar2 = 0x3a9;
                            uVar1 = 0x3a9;
                          }
                        }
                        else {
                          uVar2 = 0x3ac;
                          uVar1 = 0x3ac;
                        }
                      }
                      else {
                        uVar2 = 0x3a8;
                        uVar1 = 0x3a8;
                      }
                    }
                    else {
                      uVar2 = 0x3bb;
                      uVar1 = 0x3bb;
                    }
                  }
                  else {
                    uVar2 = 0x3be;
                    uVar1 = 0x3be;
                  }
                }
                else {
                  uVar2 = 0x3bd;
                  uVar1 = 0x3bd;
                }
              }
              else {
                uVar2 = 0x3ba;
                uVar1 = 0x3ba;
              }
            }
            else {
              uVar2 = 0x3b9;
              uVar1 = 0x3b9;
            }
          }
          else {
            uVar2 = 0x3bc;
            uVar1 = 0x3bc;
          }
        }
        else {
          uVar2 = 0x3b8;
          uVar1 = 0x3b8;
        }
      }
      else {
        uVar2 = 0x3fb;
        uVar1 = 0x3fb;
      }
    }
    else {
      uVar2 = 0x3f2;
      uVar1 = 0x3f2;
    }
  }
  else {
    uVar2 = 0x3f5;
    uVar1 = 0x3f5;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_7xx(CPUPPCState *env)
{
    /* Breakpoints */
    /* XXX : not implemented */
    spr_register_kvm(env, SPR_DABR, "DABR",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_DABR, 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_IABR, "IABR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Cache management */
    /* XXX : not implemented */
    spr_register(env, SPR_ICTC, "ICTC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Performance monitors */
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_MMCR0, "MMCR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_MMCR1, "MMCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC1, "PMC1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC2, "PMC2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC3, "PMC3",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC4, "PMC4",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_SIAR, "SIAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UMMCR0, "UMMCR0",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UMMCR1, "UMMCR1",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC1, "UPMC1",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC2, "UPMC2",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC3, "UPMC3",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC4, "UPMC4",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_USIAR, "USIAR",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* External access control */
    /* XXX : not implemented */
    spr_register(env, SPR_EAR, "EAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}